

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O3

int __thiscall
LPCMStreamReader::getTSDescriptor
          (LPCMStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint8_t *buffer;
  int iStack_28;
  int local_24;
  
  buffer = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer;
  if (this->m_headerType == htNone) {
    bVar1 = detectLPCMType(this,buffer,
                           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                 m_bufEnd - (long)buffer);
    if (!bVar1) {
      return 0;
    }
    buffer = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer;
    if ((this->m_headerType == htNone) &&
       (bVar1 = detectLPCMType(this,buffer,
                               (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader
                                     .m_bufEnd - (long)buffer), !bVar1)) {
      return 0;
    }
  }
  if ((buffer != (uint8_t *)0x0) &&
     (iVar2 = decodeFrame(this,buffer,
                          (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
                          &local_24,&iStack_28), 0 < iVar2)) {
    dstBuff[0] = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    dstBuff[7] = 0x80;
    bVar3 = 0x60;
    if (this->m_channels < 3) {
      bVar3 = (this->m_channels == 2) << 5 | 0x10;
    }
    bVar4 = 5;
    if (this->m_freq != 0x2ee00) {
      bVar4 = (this->m_freq == 96000) * '\x03' + 1;
    }
    dstBuff[8] = bVar4 | bVar3;
    dstBuff[9] = ((char)this->m_bitsPerSample << 4 | 0x3fU) + 0x40;
    return 10;
  }
  return 0;
}

Assistant:

int LPCMStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, bool hdmvDescriptors)
{
    if (m_headerType == LPCMHeaderType::htNone)
        if (!detectLPCMType(m_buffer, m_bufEnd - m_buffer))
            return 0;
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    const int len = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
    if (len < 1)
        return 0;

    // Blu-ray core specifications Table 9-11 - HDMV LPCM audio registration descriptor
    uint8_t* curPos = dstBuff;
    *curPos++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);  // descriptor tag
    *curPos++ = 8;                                                    // descriptor length
    *curPos++ = 'H';
    *curPos++ = 'D';
    *curPos++ = 'M';
    *curPos++ = 'V';
    *curPos++ = 0xff;  // stuffing_bits

    *curPos++ = static_cast<uint8_t>(TSDescriptorTag::LPCM);  // descriptor tag
    const int audio_presentation_type = (m_channels > 2) ? 6 : (m_channels == 2) ? 3 : 1;
    const int sampling_frequency = (m_freq == 192000) ? 5 : (m_freq == 96000) ? 4 : 1;
    *curPos++ = static_cast<uint8_t>(audio_presentation_type << 4 | sampling_frequency);
    *curPos++ = static_cast<uint8_t>((m_bitsPerSample - 12) << 4 | 0x3f);  // bits_per_sample (2 bits), stuffing_bits

    return static_cast<int>(curPos - dstBuff);
}